

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicProfileInfo.h
# Opt level: O0

bool __thiscall
Js::BufferReader::ReadArray<ValueType>(BufferReader *this,ValueType *data,size_t len)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  ulong sizeInBytes;
  size_t size;
  size_t len_local;
  ValueType *data_local;
  BufferReader *this_local;
  
  sizeInBytes = len * 2;
  if (this->lengthLeft < sizeInBytes) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/DynamicProfileInfo.h"
                                ,0x3d6,"(false)","false");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
    this_local._7_1_ = false;
  }
  else {
    memcpy_s(data,sizeInBytes,this->current,sizeInBytes);
    this->current = this->current + sizeInBytes;
    this->lengthLeft = this->lengthLeft + len * -2;
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool ReadArray(__inout_ecount(len) T * data, size_t len)
        {
            size_t size = sizeof(T) * len;
            if (lengthLeft < size)
            {
                AssertOrFailFast(false);
                return false;
            }
            memcpy_s(data, size, current, size);
            current += size;
            lengthLeft -= size;
            return true;
        }